

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void traverse_hplane_fast_rowmajor<double,long>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               double *row_numeric_data,double *output_depth,long *tree_num,double *tree_depth,
               size_t row)

{
  pointer pIVar1;
  long lVar2;
  pointer pIVar3;
  size_t *psVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  pIVar1 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar3 = pIVar1;
  if (pIVar1->hplane_left == 0) {
    sVar5 = 0;
  }
  else {
    psVar4 = &pIVar1->hplane_left;
    do {
      lVar2 = *(long *)&(pIVar3->col_num).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      lVar6 = (long)*(pointer *)
                     ((long)&(pIVar3->col_num).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) - lVar2;
      if (lVar6 == 0) {
        dVar8 = 0.0;
      }
      else {
        lVar6 = lVar6 >> 3;
        dVar8 = 0.0;
        lVar7 = 0;
        do {
          dVar8 = dVar8 + (row_numeric_data[*(long *)(lVar2 + lVar7 * 8)] -
                          *(double *)
                           (*(long *)&(pIVar3->mean).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + lVar7 * 8)) *
                          *(double *)
                           (*(long *)&(pIVar3->coef).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + lVar7 * 8);
          lVar7 = lVar7 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
      }
      if (pIVar3->split_point < dVar8) {
        psVar4 = &pIVar3->hplane_right;
      }
      sVar5 = *psVar4;
      pIVar3 = pIVar1 + sVar5;
      psVar4 = &pIVar1[sVar5].hplane_left;
    } while (*psVar4 != 0);
  }
  dVar8 = pIVar3->score;
  *output_depth = *output_depth + dVar8;
  if (tree_num != (long *)0x0) {
    tree_num[row] = sVar5;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = dVar8;
  }
  return;
}

Assistant:

void traverse_hplane_fast_rowmajor(std::vector<IsoHPlane>  &hplane,
                                   ExtIsoForest            &model_outputs,
                                   real_t *restrict        row_numeric_data,
                                   double &restrict        output_depth,
                                   sparse_ix *restrict     tree_num,
                                   double *restrict        tree_depth,
                                   size_t                  row) noexcept
{
    size_t  curr_lev = 0;
    double  hval;

    while(true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            return;
        }

        else
        {
            hval = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
                hval += (row_numeric_data[hplane[curr_lev].col_num[col]] 
                         - hplane[curr_lev].mean[col]) * hplane[curr_lev].coef[col];

            curr_lev  = (hval <= hplane[curr_lev].split_point)?
                         hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;

        }
    }
}